

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCurl.cxx
# Opt level: O1

string * cmCurlSetNETRCOption
                   (string *__return_storage_ptr__,CURL *curl,string *netrc_level,string *netrc_file
                   )

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  CURLcode CVar4;
  undefined8 uVar5;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_80;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_60;
  size_type local_48;
  pointer local_40;
  undefined8 local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = netrc_level->_M_string_length;
  if (sVar1 == 0) {
    uVar5 = 3;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)netrc_level);
    if (iVar3 == 0) {
      uVar5 = 1;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)netrc_level);
      uVar5 = 0;
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)netrc_level);
        if (iVar3 != 0) {
          local_60.first._M_len = 0x35;
          local_60.first._M_str = "NETRC accepts OPTIONAL, IGNORED or REQUIRED but got: ";
          local_60.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
          ;
          local_40 = (netrc_level->_M_dataplus)._M_p;
          local_48 = netrc_level->_M_string_length;
          local_38 = 0;
          views._M_len = 2;
          views._M_array = &local_60;
          cmCatViews(&local_80,views);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p == &local_80.field_2) {
            return __return_storage_ptr__;
          }
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          return __return_storage_ptr__;
        }
        bVar2 = true;
        goto LAB_0029c792;
      }
      uVar5 = 2;
    }
  }
  bVar2 = false;
LAB_0029c792:
  if (sVar1 != 0 && !bVar2) {
    CVar4 = curl_easy_setopt((Curl_easy *)curl,CURLOPT_NETRC,uVar5);
    if ((CVar4 & ~CURLE_NOT_BUILT_IN) != CURLE_OK) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      curl_easy_strerror(CVar4);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if (((__return_storage_ptr__->_M_string_length == 0) && (netrc_file->_M_string_length != 0)) &&
       (CVar4 = curl_easy_setopt((Curl_easy *)curl,CURLOPT_NETRC_FILE,(netrc_file->_M_dataplus)._M_p
                                ), (CVar4 & ~CURLE_NOT_BUILT_IN) != CURLE_OK)) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      curl_easy_strerror(CVar4);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCurlSetNETRCOption(::CURL* curl, const std::string& netrc_level,
                                 const std::string& netrc_file)
{
  std::string e;
  CURL_NETRC_OPTION curl_netrc_level = CURL_NETRC_LAST;
  ::CURLcode res;

  if (!netrc_level.empty()) {
    if (netrc_level == "OPTIONAL") {
      curl_netrc_level = CURL_NETRC_OPTIONAL;
    } else if (netrc_level == "REQUIRED") {
      curl_netrc_level = CURL_NETRC_REQUIRED;
    } else if (netrc_level == "IGNORED") {
      curl_netrc_level = CURL_NETRC_IGNORED;
    } else {
      e = cmStrCat("NETRC accepts OPTIONAL, IGNORED or REQUIRED but got: ",
                   netrc_level);
      return e;
    }
  }

  if (curl_netrc_level != CURL_NETRC_LAST &&
      curl_netrc_level != CURL_NETRC_IGNORED) {
    res = ::curl_easy_setopt(curl, CURLOPT_NETRC, curl_netrc_level);
    check_curl_result(res, "Unable to set netrc level: ");
    if (!e.empty()) {
      return e;
    }

    // check to see if a .netrc file has been specified
    if (!netrc_file.empty()) {
      res = ::curl_easy_setopt(curl, CURLOPT_NETRC_FILE, netrc_file.c_str());
      check_curl_result(res, "Unable to set .netrc file path : ");
    }
  }
  return e;
}